

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O1

DdNode * cuddSplitSetRecur(DdManager *manager,st__table *mtable,int *varSeen,DdNode *p,double n,
                          double max,int index)

{
  int index_00;
  byte bVar1;
  int iVar2;
  int *piVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double *dummy;
  double *local_58;
  double local_50;
  double local_48;
  int *local_40;
  st__table *local_38;
  
  piVar3 = (int *)((ulong)p & 0xfffffffffffffffe);
  index_00 = *piVar3;
  if ((long)index_00 == 0x7fffffff) {
    pDVar4 = selectMintermsFromUniverse(manager,varSeen,n);
    return pDVar4;
  }
  pDVar4 = manager->one;
  varSeen[manager->invperm[index_00]] = -1;
  pDVar7 = (DdNode *)((ulong)*(DdNode **)(piVar3 + 4) ^ 1);
  pDVar5 = (DdNode *)((ulong)*(DdNode **)(piVar3 + 6) ^ 1);
  if (((ulong)p & 1) == 0) {
    pDVar7 = *(DdNode **)(piVar3 + 4);
    pDVar5 = *(DdNode **)(piVar3 + 6);
  }
  bVar1 = (byte)index;
  if (*(int *)((ulong)pDVar7 & 0xfffffffffffffffe) == 0x7fffffff) {
    if (*(int *)((ulong)pDVar5 & 0xfffffffffffffffe) == 0x7fffffff) {
      pDVar4 = selectMintermsFromUniverse(manager,varSeen,n);
      if (pDVar4 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar3 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + 1;
      pDVar5 = cuddBddAndRecur(manager,p,pDVar4);
      if (pDVar5 != (DdNode *)0x0) {
        uVar8 = (ulong)pDVar5 & 0xfffffffffffffffe;
        *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
        goto LAB_007e077c;
      }
      goto LAB_007e09ce;
    }
    dVar9 = 0.0;
    local_48 = n;
    if (pDVar7 == pDVar4) {
      dVar9 = max / (double)(2 << (bVar1 & 0x1f));
    }
  }
  else {
    local_48 = n;
    iVar2 = st__lookup(mtable,(char *)pDVar7,(char **)&local_58);
    if (iVar2 == 0) {
      return (DdNode *)0x0;
    }
    dVar9 = *local_58 / (double)(2 << (bVar1 & 0x1f));
  }
  local_40 = (int *)((ulong)pDVar5 & 0xfffffffffffffffe);
  local_38 = mtable;
  if (*local_40 == 0x7fffffff) {
    local_50 = 0.0;
    dVar10 = max;
    if (pDVar5 == pDVar4) goto LAB_007e089b;
  }
  else {
    iVar2 = st__lookup(mtable,(char *)pDVar5,(char **)&local_58);
    if (iVar2 == 0) {
      return (DdNode *)0x0;
    }
    dVar10 = *local_58;
LAB_007e089b:
    local_50 = dVar10 / (double)(2 << (bVar1 & 0x1f));
  }
  pDVar4 = cuddUniqueInter(manager,index_00,pDVar4,(DdNode *)((ulong)pDVar4 ^ 1));
  piVar3 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
  *piVar3 = *piVar3 + 1;
  if ((dVar9 != local_48) || (pDVar6 = pDVar4, NAN(dVar9) || NAN(local_48))) {
    if ((local_50 != local_48) || (NAN(local_50) || NAN(local_48))) {
      if (dVar9 < local_48) {
        pDVar6 = cuddSplitSetRecur(manager,local_38,varSeen,pDVar5,local_48 - dVar9,max,index + 1);
        if (pDVar6 == (DdNode *)0x0) goto LAB_007e09ce;
        piVar3 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar3 = *piVar3 + 1;
        pDVar5 = cuddBddIteRecur(manager,pDVar4,pDVar7,pDVar6);
joined_r0x007e0996:
        if (pDVar5 != (DdNode *)0x0) {
          uVar8 = (ulong)pDVar5 & 0xfffffffffffffffe;
          *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
          Cudd_RecursiveDeref(manager,pDVar6);
LAB_007e077c:
          Cudd_RecursiveDeref(manager,pDVar4);
          *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + -1;
          return pDVar5;
        }
        Cudd_RecursiveDeref(manager,pDVar6);
      }
      else {
        if (local_50 < local_48) {
          pDVar7 = cuddSplitSetRecur(manager,local_38,varSeen,pDVar7,local_48 - local_50,max,
                                     index + 1);
          if (pDVar7 != (DdNode *)0x0) {
            piVar3 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
            *piVar3 = *piVar3 + 1;
            pDVar5 = cuddBddIteRecur(manager,pDVar4,pDVar7,pDVar5);
            if (pDVar5 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(manager,pDVar7);
              goto LAB_007e09ce;
            }
            uVar8 = (ulong)pDVar5 & 0xfffffffffffffffe;
            *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
            Cudd_RecursiveDeref(manager,pDVar7);
            goto LAB_007e077c;
          }
          goto LAB_007e09ce;
        }
        if (*(int *)((ulong)pDVar7 & 0xfffffffffffffffe) == 0x7fffffff) {
          if (*local_40 != 0x7fffffff) {
            pDVar6 = selectMintermsFromUniverse(manager,varSeen,local_48);
            if (pDVar6 == (DdNode *)0x0) goto LAB_007e09ce;
            piVar3 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar3 = *piVar3 + 1;
            pDVar5 = pDVar4;
LAB_007e0b71:
            pDVar5 = cuddBddAndRecur(manager,pDVar5,pDVar6);
            goto joined_r0x007e0996;
          }
        }
        else if (*local_40 == 0x7fffffff) {
          pDVar6 = selectMintermsFromUniverse(manager,varSeen,local_48);
          if (pDVar6 == (DdNode *)0x0) goto LAB_007e09ce;
          piVar3 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar3 = *piVar3 + 1;
          pDVar5 = (DdNode *)((ulong)pDVar4 ^ 1);
          goto LAB_007e0b71;
        }
        if (local_50 <= dVar9) {
          pDVar7 = pDVar5;
        }
        pDVar7 = cuddSplitSetRecur(manager,local_38,varSeen,pDVar7,local_48,max,index + 1);
        if (pDVar7 != (DdNode *)0x0) {
          piVar3 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
          *piVar3 = *piVar3 + 1;
          pDVar5 = (DdNode *)((ulong)pDVar4 ^ 1);
          if (dVar9 < local_50) {
            pDVar5 = pDVar4;
          }
          pDVar5 = cuddBddAndRecur(manager,pDVar5,pDVar7);
          if (pDVar5 != (DdNode *)0x0) {
            uVar8 = (ulong)pDVar5 & 0xfffffffffffffffe;
            *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
            Cudd_RecursiveDeref(manager,pDVar7);
            goto LAB_007e077c;
          }
          Cudd_RecursiveDeref(manager,pDVar7);
        }
      }
      goto LAB_007e09ce;
    }
    pDVar7 = pDVar5;
    pDVar6 = (DdNode *)((ulong)pDVar4 ^ 1);
  }
  pDVar5 = cuddBddAndRecur(manager,pDVar6,pDVar7);
  if (pDVar5 != (DdNode *)0x0) {
    piVar3 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + 1;
    Cudd_RecursiveDeref(manager,pDVar4);
    piVar3 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar3 = *piVar3 + -1;
    return pDVar5;
  }
LAB_007e09ce:
  Cudd_RecursiveDeref(manager,pDVar4);
  return (DdNode *)0x0;
}

Assistant:

DdNode*
cuddSplitSetRecur(
  DdManager * manager,
  st__table * mtable,
  int * varSeen,
  DdNode * p,
  double  n,
  double  max,
  int  index)
{
    DdNode *one, *zero, *N, *Nv;
    DdNode *Nnv, *q, *r, *v;
    DdNode *result;
    double *dummy, numT, numE;
    int variable, positive;
  
    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* If p is constant, extract n minterms from constant 1.  The procedure by
    ** construction guarantees that minterms will not be extracted from
    ** constant 0.
    */
    if (Cudd_IsConstant(p)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        return(q);
    }

    N = Cudd_Regular(p);

    /* Set variable as seen. */
    variable = N->index;
    varSeen[manager->invperm[variable]] = -1;

    Nv = cuddT(N);
    Nnv = cuddE(N);
    if (Cudd_IsComplement(p)) {
        Nv = Cudd_Not(Nv);
        Nnv = Cudd_Not(Nnv);
    }

    /* If both the children of 'p' are constants, extract n minterms from a
    ** constant node.
    */
    if (Cudd_IsConstant(Nv) && Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddAndRecur(manager,p,q);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        cuddDeref(r);
        return(r);
    }
  
    /* Lookup the # of minterms in the onset of the node from the table. */
    if (!Cudd_IsConstant(Nv)) {
        if (! st__lookup(mtable, (const char *)Nv, (char **)&dummy)) return(NULL);
        numT = *dummy/(2*(1<<index));
    } else if (Nv == one) {
        numT = max/(2*(1<<index));
    } else {
        numT = 0;
    }
  
    if (!Cudd_IsConstant(Nnv)) {
        if (! st__lookup(mtable, (const char *)Nnv, (char **)&dummy)) return(NULL);
        numE = *dummy/(2*(1<<index));
    } else if (Nnv == one) {
        numE = max/(2*(1<<index));
    } else {
        numE = 0;
    }

    v = cuddUniqueInter(manager,variable,one,zero);
    cuddRef(v);

    /* If perfect match. */
    if (numT == n) {
        q = cuddBddAndRecur(manager,v,Nv);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(q);
        return(q);
    }
    if (numE == n) {
        q = cuddBddAndRecur(manager,Cudd_Not(v),Nnv);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(q);
        return(q);
    }
    /* If n is greater than numT, extract the difference from the ELSE child
    ** and retain the function represented by the THEN branch.
    */
    if (numT < n) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nnv,(n-numT),max,index+1);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddIteRecur(manager,v,Nv,q);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(r);
        return(r);
    }
    /* If n is greater than numE, extract the difference from the THEN child
    ** and retain the function represented by the ELSE branch.
    */
    if (numE < n) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nv, (n-numE),max,index+1);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddIteRecur(manager,v,q,Nnv);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(r);    
        return(r);
    }

    /* None of the above cases; (n < numT and n < numE) and either of
    ** the Nv, Nnv or both are not constants. If possible extract the
    ** required minterms the constant branch.
    */
    if (Cudd_IsConstant(Nv) && !Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        result = cuddBddAndRecur(manager,v,q);
        if (result == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(result);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(result);
        return(result);
    } else if (!Cudd_IsConstant(Nv) && Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        result = cuddBddAndRecur(manager,Cudd_Not(v),q);
        if (result == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(result);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(result);
        return(result);
    }

    /* Both Nv and Nnv are not constants. So choose the one which
    ** has fewer minterms in its onset.
    */
    positive = 0;
    if (numT < numE) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nv,n,max,index+1);
        positive = 1;
    } else {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nnv,n,max,index+1);
    }

    if (q == NULL) {
        Cudd_RecursiveDeref(manager,v);
        return(NULL);
    }
    cuddRef(q);

    if (positive) {
        result = cuddBddAndRecur(manager,v,q);
    } else {
        result = cuddBddAndRecur(manager,Cudd_Not(v),q);
    }
    if (result == NULL) {
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        return(NULL);
    }
    cuddRef(result);
    Cudd_RecursiveDeref(manager,q);
    Cudd_RecursiveDeref(manager,v);
    cuddDeref(result);

    return(result);

}